

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfTiledOutputWriteTile(ImfTiledOutputFile *out,int dx,int dy,int lx,int ly)

{
  TiledRgbaOutputFile *pTVar1;
  ImfTiledOutputFile *in_RDI;
  exception *e;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  TiledRgbaOutputFile *in_stack_ffffffffffffffd0;
  
  pTVar1 = anon_unknown.dwarf_572a3::outfile(in_RDI);
  Imf_3_2::TiledRgbaOutputFile::writeTile
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
             (int)((ulong)pTVar1 >> 0x20),(int)pTVar1);
  return 1;
}

Assistant:

int
ImfTiledOutputWriteTile (
    ImfTiledOutputFile* out, int dx, int dy, int lx, int ly)
{
    try
    {
        outfile (out)->writeTile (dx, dy, lx, ly);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}